

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_indexed_indirect_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_13ef60::CpuIndexedIndirectTest::~CpuIndexedIndirectTest
          (CpuIndexedIndirectTest *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void run_instruction(uint8_t instruction) {
        registers.pc = expected.pc = start_pc;
        registers.x = expected.x = 0xED;
        stage_instruction(instruction);
        expected.pc += 1;

        EXPECT_CALL(mmu, read_byte(start_pc + 1u)).WillOnce(Return(0xAB));
        EXPECT_CALL(mmu, read_byte(0xAB)).WillOnce(Return(0x68)); // Dummy read
        EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + 0xED)))
                .WillOnce(Return(0x34));
        EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + 0xED + 1u)))
                .WillOnce(Return(0x12));
        EXPECT_CALL(mmu, read_byte(0x1234)).WillOnce(Return(memory_content));

        step_execution(6);
        EXPECT_EQ(expected, registers);
    }